

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CheckIfInTargetLOS
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  AActor *this;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar9;
  AActor *other;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  _func_int **local_38;
  PClass *pPVar5;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003d8ff4;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d8fe4:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d8ff4:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x111e,
                  "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003d8bd6;
    pPVar5 = (this->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar10 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar10) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d8ff4;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003d8fe4;
LAB_003d8bd6:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d9063:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x111f,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar11 = (undefined4)*(undefined8 *)&param[1].field_0;
    uVar12 = (undefined4)((ulong)*(undefined8 *)&param[1].field_0 >> 0x20);
LAB_003d8c30:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d90a1:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1120,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar6 = param[2].field_0.i;
LAB_003d8c3f:
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d9032:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1121,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar13 = param[3].field_0.f;
LAB_003d8c50:
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d9013:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1122,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d9063;
    }
    uVar11 = (undefined4)*(undefined8 *)&param[1].field_0;
    uVar12 = (undefined4)((ulong)*(undefined8 *)&param[1].field_0 >> 0x20);
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003d8c30;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d90a1;
    }
    uVar6 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003d8c3f;
    }
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d9032;
    }
    dVar13 = param[3].field_0.f;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003d8c50;
    }
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar7 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d9013;
    }
  }
  dVar1 = param[4].field_0.f;
  if ((uVar6 & 0x40) == 0) {
    if (((uVar6 & 1) == 0) || (((this->flags).Value & 0x10000) == 0)) {
      other = (this->target).field_0.p;
      if (other != (AActor *)0x0) {
        if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          paVar9 = &(this->target).field_0;
          goto LAB_003d8dec;
        }
        goto LAB_003d8cea;
      }
    }
    else if ((((this->flags2).Value & 0x40000000) != 0) &&
            (other = (this->tracer).field_0.p, other != (AActor *)0x0)) {
      if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003d8cea;
      paVar9 = &(this->tracer).field_0;
LAB_003d8dec:
      paVar9->p = (AActor *)0x0;
    }
LAB_003d8df3:
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1138,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    other = (this->master).field_0.p;
    if (other == (AActor *)0x0) goto LAB_003d8df3;
    if (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      paVar9 = &(this->master).field_0;
      goto LAB_003d8dec;
    }
LAB_003d8cea:
    if (((uVar6 & 0x20) == 0) || (0 < other->health)) {
      dVar14 = (double)CONCAT44(uVar12,uVar11);
      dVar2 = AActor::Distance3D(this,other,false);
      if (((dVar13 == 0.0) && (!NAN(dVar13))) || (dVar2 <= dVar13)) {
        uVar8 = uVar6 & 2;
        if (((dVar1 != 0.0) || (NAN(dVar1))) && (dVar2 < dVar1)) {
          if ((uVar6 & 0x10) != 0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x114d,
                            "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            goto LAB_003d8e05;
          }
          if ((uVar6 & 4) != 0) {
            dVar14 = 0.0;
          }
          uVar8 = uVar6 & 10;
        }
        if (((dVar14 <= 0.0) || (360.0 <= dVar14)) ||
           (AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(this,0)),
           ABS((double)SUB84(((double)local_38 - (other->Angles).Yaw.Degrees) * 11930464.711111112 +
                             6755399441055744.0,0) * 8.381903171539307e-08) <= dVar14 * 0.5)) {
          if ((uVar8 != 0) || (bVar10 = P_CheckSight(other,this,1), bVar10)) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1163,
                            "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            uVar11 = 1;
            if (ret->RegType != '\0') goto LAB_003d8f58;
            goto LAB_003d8e11;
          }
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1161,
                          "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
        else {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x115c,
                          "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
      }
      else {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1144,
                        "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x113d,
                      "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
  }
LAB_003d8e05:
  if (ret->RegType != '\0') {
LAB_003d8f58:
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  uVar11 = 0;
LAB_003d8e11:
  *(undefined4 *)ret->Location = uVar11;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckIfInTargetLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF	(fov)		
	PARAM_INT_DEF	(flags)		
	PARAM_FLOAT_DEF	(dist_max)	
	PARAM_FLOAT_DEF	(dist_close)

	AActor *target;

	if (flags & JLOSF_CHECKMASTER)
	{
		target = self->master;
	}
	else if (self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE))
	{
		if (self->flags2 & MF2_SEEKERMISSILE)
			target = self->tracer;
		else
			target = NULL;
	}
	else
	{
		target = self->target;
	}

	if (target == NULL)
	{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
		ACTION_RETURN_BOOL(false);
	}

	if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
	{
		ACTION_RETURN_BOOL(false);
	}

	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_BOOL(false);
	}

	bool doCheckSight = !(flags & JLOSF_NOSIGHT);

	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_BOOL(false);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (fov > 0 && (fov < 360.))
	{
		DAngle an = absangle(target->AngleTo(self), target->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_BOOL(false); // [KS] Outside of FOV - return
		}
	}
	if (doCheckSight && !P_CheckSight (target, self, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_BOOL(false);
	}
	ACTION_RETURN_BOOL(true);
}